

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O3

void Vec_WrdPush(Vec_Wrd_t *p,word Entry)

{
  uint uVar1;
  int iVar2;
  word *pwVar3;
  
  uVar1 = p->nSize;
  if (uVar1 == p->nCap) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (word *)0x0) {
        pwVar3 = (word *)malloc(0x80);
      }
      else {
        pwVar3 = (word *)realloc(p->pArray,0x80);
      }
      p->pArray = pwVar3;
      if (pwVar3 == (word *)0x0) {
LAB_008c1cc4:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
      }
      p->nCap = 0x10;
    }
    else {
      if (p->pArray == (word *)0x0) {
        pwVar3 = (word *)malloc((ulong)uVar1 << 4);
      }
      else {
        pwVar3 = (word *)realloc(p->pArray,(ulong)uVar1 << 4);
      }
      p->pArray = pwVar3;
      if (pwVar3 == (word *)0x0) goto LAB_008c1cc4;
      p->nCap = uVar1 * 2;
    }
  }
  else {
    pwVar3 = p->pArray;
  }
  iVar2 = p->nSize;
  p->nSize = iVar2 + 1;
  pwVar3[iVar2] = Entry;
  return;
}

Assistant:

static inline void Vec_WrdPush( Vec_Wrd_t * p, word Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WrdGrow( p, 16 );
        else
            Vec_WrdGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}